

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_support_format_tar(archive *_a)

{
  int iVar1;
  void *format_data;
  wchar_t magic_test;
  wchar_t r;
  tar *tar;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_tar");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    format_data = calloc(1,0x1c0);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate tar data");
      _a_local._4_4_ = L'\xffffffe2';
    }
    else {
      iVar1 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"tar",archive_read_format_tar_bid,
                         archive_read_format_tar_options,archive_read_format_tar_read_header,
                         archive_read_format_tar_read_data,archive_read_format_tar_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_tar_cleanup,(_func_int_archive_read_ptr *)0x0,
                         (_func_int_archive_read_ptr *)0x0);
      if (iVar1 != 0) {
        free(format_data);
      }
      _a_local._4_4_ = L'\0';
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_tar(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct tar *tar;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_tar");

	tar = (struct tar *)calloc(1, sizeof(*tar));
#ifdef HAVE_COPYFILE_H
	/* Set this by default on Mac OS. */
	tar->process_mac_extensions = 1;
#endif
	if (tar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate tar data");
		return (ARCHIVE_FATAL);
	}

	r = __archive_read_register_format(a, tar, "tar",
	    archive_read_format_tar_bid,
	    archive_read_format_tar_options,
	    archive_read_format_tar_read_header,
	    archive_read_format_tar_read_data,
	    archive_read_format_tar_skip,
	    NULL,
	    archive_read_format_tar_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK)
		free(tar);
	return (ARCHIVE_OK);
}